

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyPixels.cpp
# Opt level: O2

void anon_unknown.dwarf_d5617::writeCopyRead
               (string *tempDir,Array2D<Imath_3_2::half> *ph,int w,int h,int dx,int dy)

{
  half *phVar1;
  float fVar2;
  int iVar3;
  _Alloc_hider __filename;
  _Alloc_hider __filename_00;
  bool bVar4;
  char cVar5;
  int iVar6;
  ostream *poVar7;
  int *piVar8;
  char *pcVar9;
  Header *pHVar10;
  Box<Imath_3_2::Vec2<int>_> *pBVar11;
  Box<Imath_3_2::Vec2<int>_> *pBVar12;
  float *pfVar13;
  float *pfVar14;
  ChannelList *this;
  ChannelList *pCVar15;
  long lVar16;
  half *phVar17;
  long lVar18;
  half *phVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  FrameBuffer fb;
  InputFile in2;
  Array2D<Imath_3_2::half> ph2;
  Array2D<Imath_3_2::half> ph1;
  int local_148;
  int local_140;
  FrameBuffer fb2;
  Header hdr;
  OutputFile out;
  InputFile in1;
  string filename2;
  string filename1;
  
  std::operator+(&filename1,tempDir,"imf_test_copy1.exr");
  std::operator+(&filename2,tempDir,"imf_test_copy2.exr");
  iVar21 = 0;
  while( true ) {
    __filename_00._M_p = filename1._M_dataplus._M_p;
    __filename._M_p = filename2._M_dataplus._M_p;
    if (iVar21 == 10) {
      std::__cxx11::string::~string((string *)&filename2);
      std::__cxx11::string::~string((string *)&filename1);
      return;
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"compression ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar21);
    std::operator<<(poVar7,":");
    std::ostream::flush();
    _out = 0;
    fb2._map._M_t._M_impl._0_8_ = 0;
    fb._map._M_t._M_impl._0_4_ = w;
    fb._map._M_t._M_impl._4_4_ = h;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = w + 0x172;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = h + 0x22e;
    Imf_3_4::Header::Header
              (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
    piVar8 = (int *)Imf_3_4::Header::compression();
    *piVar8 = iVar21;
    pcVar9 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar9,(Channel *)0x1a5faf);
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_4::Slice::Slice
              ((Slice *)&out,HALF,(char *)(ph->_data + ph->_sizeY * (long)-h + (long)-w),2,0x2e6,1,1
               ,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1a5faf);
    std::operator<<((ostream *)&std::cout," writing");
    std::ostream::flush();
    remove(__filename_00._M_p);
    iVar6 = Imf_3_4::globalThreadCount();
    Imf_3_4::OutputFile::OutputFile(&out,__filename_00._M_p,&hdr,iVar6);
    Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
    Imf_3_4::OutputFile::writePixels((int)(Channel *)&out);
    Imf_3_4::OutputFile::~OutputFile(&out);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&fb);
    std::operator<<((ostream *)&std::cout," copying");
    std::ostream::flush();
    remove(__filename._M_p);
    iVar6 = Imf_3_4::globalThreadCount();
    Imf_3_4::InputFile::InputFile((InputFile *)&out,__filename_00._M_p,iVar6);
    pHVar10 = (Header *)Imf_3_4::InputFile::header();
    iVar6 = Imf_3_4::globalThreadCount();
    Imf_3_4::OutputFile::OutputFile((OutputFile *)&fb,__filename._M_p,pHVar10,iVar6);
    Imf_3_4::OutputFile::copyPixels((InputFile *)&fb);
    Imf_3_4::OutputFile::~OutputFile((OutputFile *)&fb);
    Imf_3_4::InputFile::~InputFile((InputFile *)&out);
    std::operator<<((ostream *)&std::cout," reading");
    std::ostream::flush();
    iVar6 = Imf_3_4::globalThreadCount();
    Imf_3_4::InputFile::InputFile(&in1,__filename_00._M_p,iVar6);
    iVar6 = Imf_3_4::globalThreadCount();
    Imf_3_4::InputFile::InputFile(&in2,__filename._M_p,iVar6);
    Imf_3_4::InputFile::header();
    piVar8 = (int *)Imf_3_4::Header::dataWindow();
    iVar6 = piVar8[2];
    lVar18 = (long)*piVar8;
    lVar20 = (iVar6 - lVar18) + 1;
    iVar3 = piVar8[1];
    lVar16 = (long)piVar8[3] - (long)iVar3;
    lVar22 = lVar16 + 1;
    Imf_3_4::Array2D<Imath_3_2::half>::Array2D(&ph1,lVar22,lVar20);
    Imf_3_4::Array2D<Imath_3_2::half>::Array2D(&ph2,lVar22,lVar20);
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar22 = -(long)iVar3;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_4::Slice::Slice
              ((Slice *)&out,HALF,(char *)(ph1._data + (ph1._sizeY * lVar22 - lVar18)),2,lVar20 * 2,
               1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1a5faf);
    Imf_3_4::Slice::Slice
              ((Slice *)&out,HALF,(char *)(ph2._data + (lVar22 * ph2._sizeY - lVar18)),2,lVar20 * 2,
               1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&fb2,(Slice *)0x1a5faf);
    Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&in1);
    Imf_3_4::InputFile::readPixels((int)&in1,piVar8[1]);
    Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&in2);
    Imf_3_4::InputFile::readPixels((int)&in2,piVar8[1]);
    std::operator<<((ostream *)&std::cout," comparing");
    std::ostream::flush();
    Imf_3_4::InputFile::header();
    pBVar11 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
    pBVar12 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
    bVar4 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar11,pBVar12);
    if (!bVar4) {
      __assert_fail("in2.header ().displayWindow () == hdr.displayWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                    ,0x92,
                    "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::InputFile::header();
    pBVar11 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
    pBVar12 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
    bVar4 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar11,pBVar12);
    if (!bVar4) {
      __assert_fail("in2.header ().dataWindow () == hdr.dataWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                    ,0x93,
                    "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::InputFile::header();
    pfVar13 = (float *)Imf_3_4::Header::pixelAspectRatio();
    fVar2 = *pfVar13;
    pfVar13 = (float *)Imf_3_4::Header::pixelAspectRatio();
    if ((fVar2 != *pfVar13) || (NAN(fVar2) || NAN(*pfVar13))) break;
    Imf_3_4::InputFile::header();
    pfVar13 = (float *)Imf_3_4::Header::screenWindowCenter();
    pfVar14 = (float *)Imf_3_4::Header::screenWindowCenter();
    if ((((*pfVar13 != *pfVar14) || (NAN(*pfVar13) || NAN(*pfVar14))) || (pfVar13[1] != pfVar14[1]))
       || (NAN(pfVar13[1]) || NAN(pfVar14[1]))) {
      __assert_fail("in2.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                    ,0x96,
                    "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::InputFile::header();
    pfVar13 = (float *)Imf_3_4::Header::screenWindowWidth();
    fVar2 = *pfVar13;
    pfVar13 = (float *)Imf_3_4::Header::screenWindowWidth();
    if ((fVar2 != *pfVar13) || (NAN(fVar2) || NAN(*pfVar13))) {
      __assert_fail("in2.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                    ,0x97,
                    "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::InputFile::header();
    piVar8 = (int *)Imf_3_4::Header::lineOrder();
    iVar3 = *piVar8;
    piVar8 = (int *)Imf_3_4::Header::lineOrder();
    if (iVar3 != *piVar8) {
      __assert_fail("in2.header ().lineOrder () == hdr.lineOrder ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                    ,0x98,
                    "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::InputFile::header();
    piVar8 = (int *)Imf_3_4::Header::compression();
    iVar3 = *piVar8;
    piVar8 = (int *)Imf_3_4::Header::compression();
    if (iVar3 != *piVar8) {
      __assert_fail("in2.header ().compression () == hdr.compression ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                    ,0x99,
                    "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::InputFile::header();
    this = (ChannelList *)Imf_3_4::Header::channels();
    pCVar15 = (ChannelList *)Imf_3_4::Header::channels();
    cVar5 = Imf_3_4::ChannelList::operator==(this,pCVar15);
    if (cVar5 == '\0') {
      __assert_fail("in2.header ().channels () == hdr.channels ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                    ,0x9a,
                    "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                   );
    }
    local_140 = (int)(iVar6 - lVar18);
    local_148 = (int)lVar16;
    phVar17 = ph1._data;
    phVar19 = ph2._data;
    for (lVar20 = 0; lVar20 <= local_148; lVar20 = lVar20 + 1) {
      lVar22 = 0;
      while (lVar22 <= local_140) {
        fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22]._h * 4);
        phVar1 = phVar19 + lVar22;
        lVar22 = lVar22 + 1;
        pfVar13 = (float *)(_imath_half_to_float_table + (ulong)phVar1->_h * 4);
        if ((fVar2 != *pfVar13) || (NAN(fVar2) || NAN(*pfVar13))) {
          __assert_fail("ph1[y][x] == ph2[y][x]",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                        ,0x9e,
                        "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                       );
        }
      }
      phVar19 = phVar19 + ph2._sizeY;
      phVar17 = phVar17 + ph1._sizeY;
    }
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&fb2);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&fb);
    Imf_3_4::Array2D<Imath_3_2::half>::~Array2D(&ph2);
    Imf_3_4::Array2D<Imath_3_2::half>::~Array2D(&ph1);
    Imf_3_4::InputFile::~InputFile(&in2);
    Imf_3_4::InputFile::~InputFile(&in1);
    remove(__filename_00._M_p);
    remove(__filename._M_p);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    Imf_3_4::Header::~Header(&hdr);
    iVar21 = iVar21 + 1;
  }
  __assert_fail("in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                ,0x94,
                "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
               );
}

Assistant:

void
writeCopyRead (
    const std::string&   tempDir,
    const Array2D<half>& ph,
    int                  w,
    int                  h,
    int                  dx,
    int                  dy)
{
    std::string filename1 = tempDir + "imf_test_copy1.exr";
    std::string filename2 = tempDir + "imf_test_copy2.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        writeCopyRead (
            ph,
            filename1.c_str (),
            filename2.c_str (),
            w,
            h,
            dx,
            dy,
            Compression (comp));
    }
}